

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O0

upb_EncodeStatus
upb_Encoder_Encode(upb_encstate *encoder,upb_Message *msg,upb_MiniTable *l,char **buf,size_t *size,
                  _Bool prepend_len)

{
  int iVar1;
  upb_encstate *local_50;
  size_t encoded_msg_size;
  size_t *psStack_40;
  _Bool prepend_len_local;
  size_t *size_local;
  char **buf_local;
  upb_MiniTable *l_local;
  upb_Message *msg_local;
  upb_encstate *encoder_local;
  upb_Message *local_10;
  
  encoded_msg_size._7_1_ = prepend_len;
  psStack_40 = size;
  size_local = (size_t *)buf;
  buf_local = (char **)l;
  l_local = (upb_MiniTable *)msg;
  msg_local = (upb_Message *)encoder;
  iVar1 = _setjmp((__jmp_buf_tag *)encoder->err);
  if (iVar1 == 0) {
    encode_message((upb_encstate *)msg_local,(upb_Message *)l_local,(upb_MiniTable *)buf_local,
                   (size_t *)&local_50);
    if ((encoded_msg_size._7_1_ & 1) != 0) {
      local_10 = msg_local;
      encoder_local = local_50;
      if ((local_50 < (upb_encstate *)0x80) &&
         (msg_local[0x1c].field_0.internal_opaque != msg_local[0x1b].field_0.internal_opaque)) {
        msg_local[0x1c].field_0 =
             (anon_union_8_2_9eb4e620_for_upb_Message_0)
             (msg_local[0x1c].field_0.internal_opaque + -1);
        *(char *)msg_local[0x1c].field_0 = (char)local_50;
      }
      else {
        encode_longvarint((upb_encstate *)msg_local,(uint64_t)local_50);
      }
    }
    *psStack_40 = msg_local[0x1d].field_0.internal_opaque - msg_local[0x1c].field_0.internal_opaque;
    if (*psStack_40 == 0) {
      *size_local = (size_t)&upb_Encoder_Encode::ch;
    }
    else {
      if (msg_local[0x1c].field_0.internal_opaque == 0) {
        __assert_fail("encoder->ptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/wire/encode.c"
                      ,0x27b,
                      "upb_EncodeStatus upb_Encoder_Encode(upb_encstate *const, const upb_Message *const, const upb_MiniTable *const, char **const, size_t *const, _Bool)"
                     );
      }
      *size_local = (size_t)msg_local[0x1c].field_0;
    }
  }
  else {
    if (*(int *)&msg_local->field_0 == 0) {
      __assert_fail("encoder->status != kUpb_EncodeStatus_Ok",
                    "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/upb/wire/encode.c"
                    ,0x27f,
                    "upb_EncodeStatus upb_Encoder_Encode(upb_encstate *const, const upb_Message *const, const upb_MiniTable *const, char **const, size_t *const, _Bool)"
                   );
    }
    *size_local = 0;
    *psStack_40 = 0;
  }
  _upb_mapsorter_destroy((_upb_mapsorter *)(msg_local + 0x1f));
  return *(upb_EncodeStatus *)&msg_local->field_0;
}

Assistant:

static upb_EncodeStatus upb_Encoder_Encode(upb_encstate* const encoder,
                                           const upb_Message* const msg,
                                           const upb_MiniTable* const l,
                                           char** const buf, size_t* const size,
                                           bool prepend_len) {
  // Unfortunately we must continue to perform hackery here because there are
  // code paths which blindly copy the returned pointer without bothering to
  // check for errors until much later (b/235839510). So we still set *buf to
  // NULL on error and we still set it to non-NULL on a successful empty result.
  if (UPB_SETJMP(encoder->err) == 0) {
    size_t encoded_msg_size;
    encode_message(encoder, msg, l, &encoded_msg_size);
    if (prepend_len) {
      encode_varint(encoder, encoded_msg_size);
    }
    *size = encoder->limit - encoder->ptr;
    if (*size == 0) {
      static char ch;
      *buf = &ch;
    } else {
      UPB_ASSERT(encoder->ptr);
      *buf = encoder->ptr;
    }
  } else {
    UPB_ASSERT(encoder->status != kUpb_EncodeStatus_Ok);
    *buf = NULL;
    *size = 0;
  }

  _upb_mapsorter_destroy(&encoder->sorter);
  return encoder->status;
}